

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::QueryPool::anon_unknown_0::ComputeInvocationsSecondaryTestInstance::checkResult
          (TestStatus *__return_storage_ptr__,ComputeInvocationsSecondaryTestInstance *this,
          SharedPtr<vkt::Draw::Buffer> *buffer,VkDeviceSize bufferSizeBytes,VkQueryPool queryPool)

{
  uint uVar1;
  deUint64 device_00;
  VkDevice vkd;
  deUint32 dVar2;
  VkResult result_00;
  deUint32 b;
  size_type sVar3;
  const_reference pvVar4;
  Buffer *this_00;
  VkDeviceSize offset;
  ulong uVar5;
  allocator<char> local_131;
  string local_130;
  int local_110;
  allocator<char> local_109;
  string local_108;
  uint local_e4;
  ulong uStack_e0;
  deUint32 ndx;
  size_t parametersNdx_1;
  void *pvStack_d0;
  deUint32 minSize;
  deUint32 *bufferPtr;
  Allocation local_c0;
  Allocation *local_a0;
  Allocation *bufferAllocation;
  allocator<char> local_81;
  string local_80;
  ComputeInvocationsSecondaryTestInstance *local_60;
  ulong local_58;
  size_t parametersNdx;
  deUint64 expected;
  deUint64 result;
  VkDevice device;
  DeviceInterface *vk;
  VkDeviceSize bufferSizeBytes_local;
  SharedPtr<vkt::Draw::Buffer> *buffer_local;
  ComputeInvocationsSecondaryTestInstance *this_local;
  VkQueryPool queryPool_local;
  
  vk = (DeviceInterface *)bufferSizeBytes;
  bufferSizeBytes_local = (VkDeviceSize)buffer;
  buffer_local = (SharedPtr<vkt::Draw::Buffer> *)this;
  this_local = (ComputeInvocationsSecondaryTestInstance *)queryPool.m_internal;
  queryPool_local.m_internal = (deUint64)__return_storage_ptr__;
  device = (VkDevice)
           Context::getDeviceInterface
                     ((this->super_ComputeInvocationsTestInstance).super_StatisticQueryTestInstance.
                      super_TestInstance.m_context);
  result = (deUint64)
           Context::getDevice((this->super_ComputeInvocationsTestInstance).
                              super_StatisticQueryTestInstance.super_TestInstance.m_context);
  expected = 0;
  parametersNdx = 0;
  for (local_58 = 0; uVar5 = local_58,
      sVar3 = std::
              vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
              ::size((this->super_ComputeInvocationsTestInstance).m_parameters), uVar5 < sVar3;
      local_58 = local_58 + 1) {
    pvVar4 = std::
             vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
             ::operator[]((this->super_ComputeInvocationsTestInstance).m_parameters,local_58);
    dVar2 = ComputeInvocationsTestInstance::getComputeExecution
                      (&this->super_ComputeInvocationsTestInstance,pvVar4);
    parametersNdx = dVar2 + parametersNdx;
  }
  local_60 = this_local;
  result_00 = (**(code **)(*(long *)device + 0x100))(device,result,this_local,0,1,8,&expected,0,1);
  ::vk::checkResult(result_00,
                    "vk.getQueryPoolResults(device, queryPool, 0u, 1u, sizeof(deUint64), &result, 0u, VK_QUERY_RESULT_64_BIT)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolStatisticsTests.cpp"
                    ,0x21e);
  if (parametersNdx == expected) {
    this_00 = de::SharedPtr<vkt::Draw::Buffer>::operator->(buffer);
    Draw::Buffer::getBoundMemory(&local_c0,this_00);
    vkd = device;
    device_00 = result;
    local_a0 = &local_c0;
    bufferPtr = (deUint32 *)::vk::Allocation::getMemory(&local_c0);
    offset = ::vk::Allocation::getOffset(local_a0);
    ::vk::invalidateMappedMemoryRange
              ((DeviceInterface *)vkd,(VkDevice)device_00,(VkDeviceMemory)bufferPtr,offset,
               (VkDeviceSize)vk);
    pvStack_d0 = ::vk::Allocation::getHostPtr(local_a0);
    parametersNdx_1._4_4_ = 0xffffffff;
    for (uStack_e0 = 0; uVar5 = uStack_e0,
        sVar3 = std::
                vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
                ::size((this->super_ComputeInvocationsTestInstance).m_parameters),
        dVar2 = parametersNdx_1._4_4_, uVar5 < sVar3; uStack_e0 = uStack_e0 + 1) {
      pvVar4 = std::
               vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
               ::operator[]((this->super_ComputeInvocationsTestInstance).m_parameters,uStack_e0);
      b = ComputeInvocationsTestInstance::getComputeExecution
                    (&this->super_ComputeInvocationsTestInstance,pvVar4);
      parametersNdx_1._4_4_ = deMinu32(dVar2,b);
    }
    for (local_e4 = 0; local_e4 < parametersNdx_1._4_4_; local_e4 = local_e4 + 1) {
      uVar1 = *(uint *)((long)pvStack_d0 + (ulong)local_e4 * 4);
      uVar5 = (ulong)local_e4;
      sVar3 = std::
              vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
              ::size((this->super_ComputeInvocationsTestInstance).m_parameters);
      if ((ulong)uVar1 != uVar5 * sVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_108,"Compute shader didn\'t write data to the buffer",&local_109
                  );
        tcu::TestStatus::fail(__return_storage_ptr__,&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        std::allocator<char>::~allocator(&local_109);
        local_110 = 1;
        goto LAB_00cb50cc;
      }
    }
    local_110 = 0;
LAB_00cb50cc:
    ::vk::Allocation::~Allocation(&local_c0);
    if (local_110 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"Pass",&local_131);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::allocator<char>::~allocator(&local_131);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"QueryPoolResults incorrect",&local_81);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus ComputeInvocationsSecondaryTestInstance::checkResult (const de::SharedPtr<Buffer> buffer, const VkDeviceSize bufferSizeBytes, const VkQueryPool queryPool)
{
	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	{
		deUint64 result		= 0u;
		deUint64 expected	= 0u;
		for(size_t parametersNdx = 0; parametersNdx < m_parameters.size(); ++parametersNdx)
			expected += getComputeExecution(m_parameters[parametersNdx]);
		VK_CHECK(vk.getQueryPoolResults(device, queryPool, 0u, 1u, sizeof(deUint64), &result, 0u, VK_QUERY_RESULT_64_BIT));
		if (expected != result)
			return tcu::TestStatus::fail("QueryPoolResults incorrect");
	}

	{
		// Validate the results
		const Allocation&	bufferAllocation	= buffer->getBoundMemory();
		invalidateMappedMemoryRange(vk, device, bufferAllocation.getMemory(), bufferAllocation.getOffset(), bufferSizeBytes);
		const deUint32*		bufferPtr			= static_cast<deUint32*>(bufferAllocation.getHostPtr());
		deUint32			minSize				= ~0u;
		for(size_t parametersNdx = 0; parametersNdx < m_parameters.size(); ++parametersNdx)
			minSize = deMinu32(minSize, getComputeExecution(m_parameters[parametersNdx]));
		for (deUint32 ndx = 0u; ndx < minSize; ++ndx)
		{
			if (bufferPtr[ndx] != ndx * m_parameters.size())
				return tcu::TestStatus::fail("Compute shader didn't write data to the buffer");
		}
	}
	return tcu::TestStatus::pass("Pass");
}